

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

char * nlohmann::detail::to_chars<double>(char *first,char *last,double value)

{
  char *pcVar1;
  ulong uVar2;
  int decimal_exponent;
  int len;
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sikorski-as[P]beeper/src/json.hpp"
                  ,0x2edc,
                  "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                 );
  }
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_00113e80);
    *first = '-';
    first = first + 1;
  }
  if ((value != 0.0) || (NAN(value))) {
    uVar2 = (long)last - (long)first;
    if ((long)uVar2 < 0x11) {
      __assert_fail("last - first >= std::numeric_limits<FloatType>::max_digits10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sikorski-as[P]beeper/src/json.hpp"
                    ,0x2eee,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    len = 0;
    decimal_exponent = 0;
    dtoa_impl::grisu2<double>(first,&len,&decimal_exponent,value);
    if (0x11 < len) {
      __assert_fail("len <= std::numeric_limits<FloatType>::max_digits10",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sikorski-as[P]beeper/src/json.hpp"
                    ,0x2ef8,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    if (uVar2 < 0x16) {
      __assert_fail("last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sikorski-as[P]beeper/src/json.hpp"
                    ,0x2f00,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    if (uVar2 == 0x16) {
      __assert_fail("last - first >= std::numeric_limits<FloatType>::max_digits10 + 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sikorski-as[P]beeper/src/json.hpp"
                    ,0x2f01,
                    "char *nlohmann::detail::to_chars(char *, const char *, FloatType) [FloatType = double]"
                   );
    }
    pcVar1 = dtoa_impl::format_buffer(first,len,decimal_exponent,-4,0xf);
  }
  else {
    first[0] = '0';
    first[1] = '.';
    first[2] = '0';
    pcVar1 = first + 3;
  }
  return pcVar1;
}

Assistant:

char* to_chars(char* first, const char* last, FloatType value)
{
    static_cast<void>(last); // maybe unused - fix warning
    assert(std::isfinite(value));

    // Use signbit(value) instead of (value < 0) since signbit works for -0.
    if (std::signbit(value))
    {
        value = -value;
        *first++ = '-';
    }

    if (value == 0) // +-0
    {
        *first++ = '0';
        // Make it look like a floating-point number (#362, #378)
        *first++ = '.';
        *first++ = '0';
        return first;
    }

    assert(last - first >= std::numeric_limits<FloatType>::max_digits10);

    // Compute v = buffer * 10^decimal_exponent.
    // The decimal digits are stored in the buffer, which needs to be interpreted
    // as an unsigned decimal integer.
    // len is the length of the buffer, i.e. the number of decimal digits.
    int len = 0;
    int decimal_exponent = 0;
    dtoa_impl::grisu2(first, len, decimal_exponent, value);

    assert(len <= std::numeric_limits<FloatType>::max_digits10);

    // Format the buffer like printf("%.*g", prec, value)
    constexpr int kMinExp = -4;
    // Use digits10 here to increase compatibility with version 2.
    constexpr int kMaxExp = std::numeric_limits<FloatType>::digits10;

    assert(last - first >= kMaxExp + 2);
    assert(last - first >= 2 + (-kMinExp - 1) + std::numeric_limits<FloatType>::max_digits10);
    assert(last - first >= std::numeric_limits<FloatType>::max_digits10 + 6);

    return dtoa_impl::format_buffer(first, len, decimal_exponent, kMinExp, kMaxExp);
}